

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O0

sexp sexp_quotient(sexp ctx,sexp a,sexp b)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int iVar3;
  int iVar4;
  sexp psVar5;
  sexp in_RDX;
  sexp in_RSI;
  sexp in_RDI;
  double dVar6;
  double dVar7;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp tmp;
  sexp r;
  int bt;
  int at;
  sexp in_stack_ffffffffffffff88;
  sexp in_stack_ffffffffffffff90;
  sexp in_stack_ffffffffffffff98;
  sexp in_stack_ffffffffffffffa0;
  sexp in_stack_ffffffffffffffa8;
  sexp self;
  sexp_gc_var_t local_48;
  sexp local_38;
  sexp local_30;
  sexp local_8;
  
  iVar3 = sexp_number_type(in_RSI);
  iVar4 = sexp_number_type(in_RDX);
  local_30 = (sexp)&DAT_0000043e;
  local_38 = (sexp)&DAT_0000043e;
  memset(&local_48,0,0x10);
  local_8 = in_RSI;
  if (in_RDX != (sexp)&DAT_00000003) {
    local_48.var = &local_38;
    local_48.next = (in_RDI->value).context.saves;
    (in_RDI->value).context.saves = &local_48;
    psVar5 = (sexp)(ulong)(uint)(iVar4 + iVar3 * 6);
    switch(psVar5) {
    case (sexp)0x0:
    case (sexp)0x1:
    case (sexp)0x2:
    case (sexp)0x3:
      local_30 = sexp_type_exception(psVar5,in_stack_ffffffffffffffa8,
                                     (sexp_uint_t)in_stack_ffffffffffffffa0,
                                     in_stack_ffffffffffffff98);
      break;
    case (sexp)0x6:
    case (sexp)0xc:
    case (sexp)0x12:
      local_30 = sexp_type_exception(psVar5,in_stack_ffffffffffffffa8,
                                     (sexp_uint_t)in_stack_ffffffffffffffa0,
                                     in_stack_ffffffffffffff98);
      break;
    case (sexp)0x7:
      auVar1._8_8_ = (long)in_RSI >> 0x3f;
      auVar1._0_8_ = (ulong)in_RSI & 0xfffffffffffffffe;
      psVar5 = SUB168(auVar1 / SEXT816(2),0);
      auVar2._8_8_ = (long)in_RDX >> 0x3f;
      auVar2._0_8_ = (ulong)in_RDX & 0xfffffffffffffffe;
      local_30 = (sexp)((long)psVar5 / SUB168(auVar2 / SEXT816(2),0) << 1 | 1);
      if ((((long)in_RSI < 0) && ((long)in_RDX < 0)) && ((long)local_30 < 0)) {
        local_38 = sexp_fixnum_to_bignum(in_stack_ffffffffffffffa0,psVar5);
        local_30 = sexp_quotient(in_RSI,in_RDX,(sexp)CONCAT44(iVar3,iVar4));
      }
      break;
    case (sexp)0x8:
    case (sexp)0x14:
    case (sexp)0x1a:
      dVar6 = (in_RDX->value).flonum;
      dVar7 = trunc((in_RDX->value).flonum);
      if ((dVar6 != dVar7) || (NAN(dVar6) || NAN(dVar7))) {
        local_30 = sexp_type_exception(psVar5,in_stack_ffffffffffffffa8,(sexp_uint_t)dVar6,
                                       in_stack_ffffffffffffff98);
      }
      else {
        sexp_double_to_bignum(in_RDI,(double)in_RSI);
        local_38 = sexp_bignum_normalize(in_stack_ffffffffffffff88);
        local_38 = sexp_quotient(in_RSI,in_RDX,(sexp)CONCAT44(iVar3,iVar4));
        local_30 = sexp_to_inexact(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
      }
      break;
    case (sexp)0x9:
      local_30 = (sexp)&DAT_00000001;
      break;
    case (sexp)0xa:
    case (sexp)0xb:
    case (sexp)0x16:
    case (sexp)0x17:
      local_30 = sexp_type_exception(psVar5,in_stack_ffffffffffffffa8,
                                     (sexp_uint_t)in_stack_ffffffffffffffa0,
                                     in_stack_ffffffffffffff98);
      break;
    case (sexp)0xd:
    case (sexp)0xe:
    case (sexp)0xf:
    case (sexp)0x10:
      self = (sexp)(in_RSI->value).flonum;
      dVar6 = trunc((in_RSI->value).flonum);
      if (((double)self != dVar6) || (NAN((double)self) || NAN(dVar6))) {
        local_30 = sexp_type_exception(psVar5,self,(sexp_uint_t)in_stack_ffffffffffffffa0,
                                       in_stack_ffffffffffffff98);
      }
      else {
        sexp_double_to_bignum(in_RDI,(double)in_RSI);
        local_38 = sexp_bignum_normalize(in_stack_ffffffffffffff88);
        local_38 = sexp_quotient(in_RSI,in_RDX,(sexp)CONCAT44(iVar3,iVar4));
        local_30 = sexp_to_inexact(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
      }
      break;
    case (sexp)0x11:
    case (sexp)0x19:
    case (sexp)0x1b:
    case (sexp)0x1c:
    case (sexp)0x1f:
    case (sexp)0x20:
    case (sexp)0x21:
    case (sexp)0x22:
    case (sexp)0x23:
      local_30 = sexp_type_exception(psVar5,in_stack_ffffffffffffffa8,
                                     (sexp_uint_t)in_stack_ffffffffffffffa0,
                                     in_stack_ffffffffffffff98);
      break;
    case (sexp)0x13:
      local_38 = sexp_fixnum_to_bignum(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    case (sexp)0x15:
      sexp_bignum_quotient(psVar5,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
      local_30 = sexp_bignum_normalize(in_stack_ffffffffffffff88);
    }
    (in_RDI->value).context.saves = local_48.next;
    local_8 = local_30;
  }
  return local_8;
}

Assistant:

sexp sexp_quotient (sexp ctx, sexp a, sexp b) {
  int at=sexp_number_type(a), bt=sexp_number_type(b);
  sexp r=SEXP_VOID;
  sexp_gc_var1(tmp);
  if (b == SEXP_ONE) return a;
  sexp_gc_preserve1(ctx, tmp);
  switch ((at * SEXP_NUM_NUMBER_TYPES) + bt) {
  case SEXP_NUM_NOT_NOT: case SEXP_NUM_NOT_FIX:
  case SEXP_NUM_NOT_FLO: case SEXP_NUM_NOT_BIG:
    r = sexp_type_exception(ctx, NULL, SEXP_FIXNUM, a);
    break;
  case SEXP_NUM_FIX_NOT: case SEXP_NUM_FLO_NOT: case SEXP_NUM_BIG_NOT:
    r = sexp_type_exception(ctx, NULL, SEXP_FIXNUM, b);
    break;
  case SEXP_NUM_FLO_FIX: case SEXP_NUM_FLO_FLO: case SEXP_NUM_FLO_BIG:
#if SEXP_USE_RATIOS
  case SEXP_NUM_FLO_RAT:
#endif
    if (sexp_flonum_value(a) != trunc(sexp_flonum_value(a))) {
      r = sexp_type_exception(ctx, NULL, SEXP_FIXNUM, a);
    } else {
      tmp = sexp_bignum_normalize(sexp_double_to_bignum(ctx, sexp_flonum_value(a)));
      tmp = sexp_quotient(ctx, tmp, b);
      r = sexp_to_inexact(ctx, tmp);
    }
    break;
#if SEXP_USE_RATIOS
  case SEXP_NUM_RAT_FIX: case SEXP_NUM_RAT_BIG: case SEXP_NUM_RAT_RAT:
#endif
#if SEXP_USE_COMPLEX
  case SEXP_NUM_FLO_CPX: case SEXP_NUM_CPX_FIX: case SEXP_NUM_CPX_FLO:
  case SEXP_NUM_CPX_BIG: case SEXP_NUM_CPX_CPX:
#if SEXP_USE_RATIOS
  case SEXP_NUM_CPX_RAT:
#endif
#endif
    r = sexp_type_exception(ctx, NULL, SEXP_FIXNUM, a);
    break;
  case SEXP_NUM_FIX_FLO: case SEXP_NUM_BIG_FLO:
#if SEXP_USE_RATIOS
  case SEXP_NUM_RAT_FLO:
#endif
    if (sexp_flonum_value(b) != trunc(sexp_flonum_value(b))) {
      r = sexp_type_exception(ctx, NULL, SEXP_FIXNUM, b);
    } else {
      tmp = sexp_bignum_normalize(sexp_double_to_bignum(ctx, sexp_flonum_value(b)));
      tmp = sexp_quotient(ctx, a, tmp);
      r = sexp_to_inexact(ctx, tmp);
    }
    break;
#if SEXP_USE_RATIOS
  case SEXP_NUM_FIX_RAT: case SEXP_NUM_BIG_RAT:
#endif
#if SEXP_USE_COMPLEX
  case SEXP_NUM_FIX_CPX: case SEXP_NUM_BIG_CPX:
#endif
    r = sexp_type_exception(ctx, NULL, SEXP_FIXNUM, b);
    break;
  case SEXP_NUM_FIX_FIX:
    r = sexp_fx_div(a, b);
    if ((sexp_sint_t)a < 0 && (sexp_sint_t)b < 0 && (sexp_sint_t)r < 0) {
      r = sexp_quotient(ctx, tmp=sexp_fixnum_to_bignum(ctx, a), b);
    }
    break;
  case SEXP_NUM_FIX_BIG:
    r = SEXP_ZERO;
    break;
  case SEXP_NUM_BIG_FIX:
    b = tmp = sexp_fixnum_to_bignum(ctx, b);
    /* ... FALLTHROUGH ... */
  case SEXP_NUM_BIG_BIG:
    r = sexp_bignum_normalize(sexp_bignum_quotient(ctx, a, b));
    break;
  }
  sexp_gc_release1(ctx);
  return r;
}